

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
               (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                begin,__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                      end,int param_3,ulong param_4)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  _Var7;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  _Var8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  pair<double,_int> *ppVar12;
  ulong uVar13;
  pair<double,_int> *ppVar14;
  pair<double,_int> *ppVar15;
  pair<double,_int> *ppVar16;
  long lVar17;
  pair<double,_int> *ppVar18;
  double __tmp;
  pair<__gnu_cxx::__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_bool>
  pVar19;
  _Iter_comp_iter<std::less<std::pair<double,_int>_>_> __cmp;
  _Iter_comp_iter<std::less<std::pair<double,_int>_>_> __cmp_1;
  _Iter_comp_iter<std::less<std::pair<double,_int>_>_> local_39;
  int local_38;
  _Iter_comp_iter<std::less<std::pair<double,_int>_>_> local_31;
  
  param_4 = param_4 & 0xffffffff;
  local_38 = param_3;
  do {
    uVar10 = (long)end._M_current - (long)begin._M_current >> 4;
    if ((long)uVar10 < 0x18) {
      ppVar12 = begin._M_current + 1;
      if ((param_4 & 1) == 0) {
        _Var8._M_current = begin._M_current;
        if (ppVar12 != end._M_current && begin._M_current != end._M_current) {
          do {
            dVar1 = _Var8._M_current[1].first;
            if ((dVar1 < (_Var8._M_current)->first) ||
               ((dVar1 <= (_Var8._M_current)->first &&
                (_Var8._M_current[1].second < (_Var8._M_current)->second)))) {
              iVar3 = _Var8._M_current[1].second;
              while( true ) {
                dVar2 = _Var8._M_current[-1].first;
                _Var8._M_current[1].first = (_Var8._M_current)->first;
                _Var8._M_current[1].second = (_Var8._M_current)->second;
                if ((dVar2 <= dVar1) && ((dVar2 < dVar1 || (_Var8._M_current[-1].second <= iVar3))))
                break;
                _Var8._M_current = _Var8._M_current + -1;
              }
              (_Var8._M_current)->first = dVar1;
              (_Var8._M_current)->second = iVar3;
            }
            ppVar15 = ppVar12 + 1;
            _Var8._M_current = ppVar12;
            ppVar12 = ppVar15;
          } while (ppVar15 != end._M_current);
        }
      }
      else if (ppVar12 != end._M_current && begin._M_current != end._M_current) {
        lVar6 = 0;
        _Var8._M_current = begin._M_current;
        do {
          dVar1 = (_Var8._M_current)->first;
          dVar2 = _Var8._M_current[1].first;
          if ((dVar2 < dVar1) ||
             ((dVar2 <= dVar1 && (_Var8._M_current[1].second < (_Var8._M_current)->second)))) {
            iVar3 = (_Var8._M_current)->second;
            iVar4 = _Var8._M_current[1].second;
            ppVar15 = ppVar12 + -1;
            _Var8._M_current[1].first = dVar1;
            ppVar12->second = iVar3;
            ppVar14 = ppVar12;
            ppVar16 = ppVar15;
            lVar17 = lVar6;
            if (ppVar15 != begin._M_current) {
              do {
                dVar1 = ppVar15[-1].first;
                if (dVar1 <= dVar2) {
                  ppVar16 = ppVar15;
                  if (dVar1 < dVar2) {
                    ppVar14 = ppVar15 + 1;
                    break;
                  }
                  if (ppVar15[-1].second <= iVar4) break;
                }
                ppVar16 = ppVar15 + -1;
                ppVar15->first = dVar1;
                ppVar15->second = ppVar15[-1].second;
                lVar17 = lVar17 + 0x10;
                ppVar14 = ppVar15;
                ppVar15 = ppVar16;
              } while (lVar17 != 0);
            }
            ppVar16->first = dVar2;
            ppVar14[-1].second = iVar4;
          }
          ppVar15 = ppVar12 + 1;
          lVar6 = lVar6 + -0x10;
          _Var8._M_current = ppVar12;
          ppVar12 = ppVar15;
        } while (ppVar15 != end._M_current);
      }
LAB_0035b06b:
      bVar5 = true;
    }
    else {
      uVar9 = uVar10 >> 1;
      _Var8._M_current = begin._M_current + uVar9;
      if ((long)uVar10 < 0x81) {
        dVar1 = (begin._M_current)->first;
        dVar2 = (_Var8._M_current)->first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && ((begin._M_current)->second < (_Var8._M_current)->second)))) {
          (_Var8._M_current)->first = dVar1;
          (begin._M_current)->first = dVar2;
          iVar3 = (_Var8._M_current)->second;
          (_Var8._M_current)->second = (begin._M_current)->second;
          (begin._M_current)->second = iVar3;
        }
        dVar1 = end._M_current[-1].first;
        dVar2 = (begin._M_current)->first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && (end._M_current[-1].second < (begin._M_current)->second)))) {
          (begin._M_current)->first = dVar1;
          end._M_current[-1].first = dVar2;
          iVar3 = (begin._M_current)->second;
          (begin._M_current)->second = end._M_current[-1].second;
          end._M_current[-1].second = iVar3;
        }
        dVar1 = (begin._M_current)->first;
        dVar2 = (_Var8._M_current)->first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && ((begin._M_current)->second < (_Var8._M_current)->second)))) {
          (_Var8._M_current)->first = dVar1;
          (begin._M_current)->first = dVar2;
          _Var7._M_current = begin._M_current;
          goto LAB_0035ab89;
        }
      }
      else {
        dVar1 = (_Var8._M_current)->first;
        dVar2 = (begin._M_current)->first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && ((_Var8._M_current)->second < (begin._M_current)->second)))) {
          (begin._M_current)->first = dVar1;
          (_Var8._M_current)->first = dVar2;
          iVar3 = (begin._M_current)->second;
          (begin._M_current)->second = (_Var8._M_current)->second;
          (_Var8._M_current)->second = iVar3;
        }
        dVar1 = end._M_current[-1].first;
        dVar2 = (_Var8._M_current)->first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && (end._M_current[-1].second < (_Var8._M_current)->second)))) {
          (_Var8._M_current)->first = dVar1;
          end._M_current[-1].first = dVar2;
          iVar3 = (_Var8._M_current)->second;
          (_Var8._M_current)->second = end._M_current[-1].second;
          end._M_current[-1].second = iVar3;
        }
        dVar1 = (_Var8._M_current)->first;
        dVar2 = (begin._M_current)->first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && ((_Var8._M_current)->second < (begin._M_current)->second)))) {
          (begin._M_current)->first = dVar1;
          (_Var8._M_current)->first = dVar2;
          iVar3 = (begin._M_current)->second;
          (begin._M_current)->second = (_Var8._M_current)->second;
          (_Var8._M_current)->second = iVar3;
        }
        ppVar12 = begin._M_current + (uVar9 - 1);
        dVar1 = ppVar12->first;
        dVar2 = begin._M_current[1].first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && (begin._M_current[uVar9 - 1].second < begin._M_current[1].second))))
        {
          begin._M_current[1].first = dVar1;
          ppVar12->first = dVar2;
          iVar3 = begin._M_current[1].second;
          begin._M_current[1].second = begin._M_current[uVar9 - 1].second;
          begin._M_current[uVar9 - 1].second = iVar3;
        }
        dVar1 = end._M_current[-2].first;
        dVar2 = ppVar12->first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && (end._M_current[-2].second < begin._M_current[uVar9 - 1].second)))) {
          ppVar12->first = dVar1;
          end._M_current[-2].first = dVar2;
          iVar3 = begin._M_current[uVar9 - 1].second;
          begin._M_current[uVar9 - 1].second = end._M_current[-2].second;
          end._M_current[-2].second = iVar3;
        }
        dVar1 = ppVar12->first;
        dVar2 = begin._M_current[1].first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && (begin._M_current[uVar9 - 1].second < begin._M_current[1].second))))
        {
          begin._M_current[1].first = dVar1;
          ppVar12->first = dVar2;
          iVar3 = begin._M_current[1].second;
          begin._M_current[1].second = begin._M_current[uVar9 - 1].second;
          begin._M_current[uVar9 - 1].second = iVar3;
        }
        ppVar15 = begin._M_current + uVar9 + 1;
        dVar1 = ppVar15->first;
        dVar2 = begin._M_current[2].first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && (begin._M_current[uVar9 + 1].second < begin._M_current[2].second))))
        {
          begin._M_current[2].first = dVar1;
          ppVar15->first = dVar2;
          iVar3 = begin._M_current[2].second;
          begin._M_current[2].second = begin._M_current[uVar9 + 1].second;
          begin._M_current[uVar9 + 1].second = iVar3;
        }
        dVar1 = end._M_current[-3].first;
        dVar2 = ppVar15->first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && (end._M_current[-3].second < begin._M_current[uVar9 + 1].second)))) {
          ppVar15->first = dVar1;
          end._M_current[-3].first = dVar2;
          iVar3 = begin._M_current[uVar9 + 1].second;
          begin._M_current[uVar9 + 1].second = end._M_current[-3].second;
          end._M_current[-3].second = iVar3;
        }
        dVar1 = ppVar15->first;
        dVar2 = begin._M_current[2].first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && (begin._M_current[uVar9 + 1].second < begin._M_current[2].second))))
        {
          begin._M_current[2].first = dVar1;
          ppVar15->first = dVar2;
          iVar3 = begin._M_current[2].second;
          begin._M_current[2].second = begin._M_current[uVar9 + 1].second;
          begin._M_current[uVar9 + 1].second = iVar3;
        }
        dVar1 = (_Var8._M_current)->first;
        dVar2 = ppVar12->first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && ((_Var8._M_current)->second < begin._M_current[uVar9 - 1].second))))
        {
          ppVar12->first = dVar1;
          (_Var8._M_current)->first = dVar2;
          iVar3 = begin._M_current[uVar9 - 1].second;
          begin._M_current[uVar9 - 1].second = (_Var8._M_current)->second;
          (_Var8._M_current)->second = iVar3;
        }
        dVar1 = ppVar15->first;
        dVar2 = (_Var8._M_current)->first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && (begin._M_current[uVar9 + 1].second < (_Var8._M_current)->second))))
        {
          (_Var8._M_current)->first = dVar1;
          ppVar15->first = dVar2;
          iVar3 = (_Var8._M_current)->second;
          (_Var8._M_current)->second = begin._M_current[uVar9 + 1].second;
          begin._M_current[uVar9 + 1].second = iVar3;
        }
        dVar1 = (_Var8._M_current)->first;
        dVar2 = ppVar12->first;
        if ((dVar1 < dVar2) ||
           ((dVar1 <= dVar2 && ((_Var8._M_current)->second < begin._M_current[uVar9 - 1].second))))
        {
          ppVar12->first = dVar1;
          (_Var8._M_current)->first = dVar2;
          iVar3 = begin._M_current[uVar9 - 1].second;
          begin._M_current[uVar9 - 1].second = (_Var8._M_current)->second;
          (_Var8._M_current)->second = iVar3;
        }
        dVar1 = (begin._M_current)->first;
        (begin._M_current)->first = (_Var8._M_current)->first;
        (_Var8._M_current)->first = dVar1;
        _Var7._M_current = _Var8._M_current;
        _Var8._M_current = begin._M_current;
LAB_0035ab89:
        iVar3 = (_Var8._M_current)->second;
        (_Var8._M_current)->second = (_Var7._M_current)->second;
        (_Var7._M_current)->second = iVar3;
      }
      if ((param_4 & 1) == 0) {
        if ((begin._M_current[-1].first < (begin._M_current)->first) ||
           ((begin._M_current[-1].first <= (begin._M_current)->first &&
            (begin._M_current[-1].second < (begin._M_current)->second)))) goto LAB_0035abb1;
        begin = partition_left<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                          (begin._M_current,end._M_current);
        begin._M_current = begin._M_current + 1;
        bVar5 = false;
      }
      else {
LAB_0035abb1:
        pVar19 = partition_right<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                           (begin._M_current,end._M_current);
        _Var8 = pVar19.first._M_current;
        uVar13 = (long)_Var8._M_current - (long)begin._M_current >> 4;
        ppVar12 = _Var8._M_current + 1;
        uVar9 = (long)end._M_current - (long)ppVar12 >> 4;
        if (((long)uVar13 < (long)(uVar10 >> 3)) || ((long)uVar9 < (long)(uVar10 >> 3))) {
          local_38 = local_38 + -1;
          if (local_38 == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::pair<double,int>>>>
                      (begin,end,&local_39);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::pair<double,int>>>>
                      (begin,end,&local_31);
            local_38 = 0;
            goto LAB_0035b06b;
          }
          if (0x17 < (long)uVar13) {
            uVar10 = uVar13 >> 2;
            dVar1 = (begin._M_current)->first;
            (begin._M_current)->first = begin._M_current[uVar10].first;
            begin._M_current[uVar10].first = dVar1;
            iVar3 = (begin._M_current)->second;
            (begin._M_current)->second = begin._M_current[uVar10].second;
            begin._M_current[uVar10].second = iVar3;
            ppVar15 = _Var8._M_current + -uVar10;
            dVar1 = _Var8._M_current[-1].first;
            _Var8._M_current[-1].first = ppVar15->first;
            ppVar15->first = dVar1;
            iVar3 = _Var8._M_current[-1].second;
            _Var8._M_current[-1].second = ppVar15->second;
            ppVar15->second = iVar3;
            if (0x80 < (long)uVar13) {
              dVar1 = begin._M_current[1].first;
              begin._M_current[1].first = begin._M_current[uVar10 + 1].first;
              begin._M_current[uVar10 + 1].first = dVar1;
              iVar3 = begin._M_current[1].second;
              begin._M_current[1].second = begin._M_current[uVar10 + 1].second;
              begin._M_current[uVar10 + 1].second = iVar3;
              dVar1 = begin._M_current[2].first;
              begin._M_current[2].first = begin._M_current[uVar10 + 2].first;
              begin._M_current[uVar10 + 2].first = dVar1;
              iVar3 = begin._M_current[2].second;
              begin._M_current[2].second = begin._M_current[uVar10 + 2].second;
              begin._M_current[uVar10 + 2].second = iVar3;
              lVar6 = -2 - uVar10;
              uVar10 = ~uVar10;
              dVar1 = _Var8._M_current[-2].first;
              _Var8._M_current[-2].first = _Var8._M_current[uVar10].first;
              _Var8._M_current[uVar10].first = dVar1;
              iVar3 = _Var8._M_current[-2].second;
              _Var8._M_current[-2].second = _Var8._M_current[uVar10].second;
              _Var8._M_current[uVar10].second = iVar3;
              dVar1 = _Var8._M_current[-3].first;
              _Var8._M_current[-3].first = _Var8._M_current[lVar6].first;
              _Var8._M_current[lVar6].first = dVar1;
              iVar3 = _Var8._M_current[-3].second;
              _Var8._M_current[-3].second = _Var8._M_current[lVar6].second;
              _Var8._M_current[lVar6].second = iVar3;
            }
          }
          if (0x17 < (long)uVar9) {
            uVar10 = uVar9 >> 2;
            dVar1 = _Var8._M_current[1].first;
            _Var8._M_current[1].first = _Var8._M_current[uVar10 + 1].first;
            _Var8._M_current[uVar10 + 1].first = dVar1;
            iVar3 = _Var8._M_current[1].second;
            _Var8._M_current[1].second = _Var8._M_current[uVar10 + 1].second;
            _Var8._M_current[uVar10 + 1].second = iVar3;
            ppVar15 = end._M_current + -uVar10;
            dVar1 = end._M_current[-1].first;
            end._M_current[-1].first = ppVar15->first;
            ppVar15->first = dVar1;
            iVar3 = end._M_current[-1].second;
            end._M_current[-1].second = ppVar15->second;
            ppVar15->second = iVar3;
            if (0x80 < (long)uVar9) {
              dVar1 = _Var8._M_current[2].first;
              _Var8._M_current[2].first = _Var8._M_current[uVar10 + 2].first;
              _Var8._M_current[uVar10 + 2].first = dVar1;
              iVar3 = _Var8._M_current[2].second;
              _Var8._M_current[2].second = _Var8._M_current[uVar10 + 2].second;
              _Var8._M_current[uVar10 + 2].second = iVar3;
              dVar1 = _Var8._M_current[3].first;
              _Var8._M_current[3].first = _Var8._M_current[uVar10 + 3].first;
              _Var8._M_current[uVar10 + 3].first = dVar1;
              iVar3 = _Var8._M_current[3].second;
              _Var8._M_current[3].second = _Var8._M_current[uVar10 + 3].second;
              _Var8._M_current[uVar10 + 3].second = iVar3;
              lVar6 = -2 - uVar10;
              uVar10 = ~uVar10;
              dVar1 = end._M_current[-2].first;
              end._M_current[-2].first = end._M_current[uVar10].first;
              end._M_current[uVar10].first = dVar1;
              iVar3 = end._M_current[-2].second;
              end._M_current[-2].second = end._M_current[uVar10].second;
              end._M_current[uVar10].second = iVar3;
              dVar1 = end._M_current[-3].first;
              end._M_current[-3].first = end._M_current[lVar6].first;
              end._M_current[lVar6].first = dVar1;
              iVar3 = end._M_current[-3].second;
              end._M_current[-3].second = end._M_current[lVar6].second;
              end._M_current[lVar6].second = iVar3;
            }
          }
        }
        else if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (begin._M_current == _Var8._M_current) {
LAB_0035af4a:
            bVar5 = true;
            if (ppVar12 == end._M_current) goto LAB_0035b06b;
            lVar6 = 0x10;
            lVar17 = 0;
            uVar10 = 0;
            do {
              ppVar15 = (pair<double,_int> *)((long)&_Var8._M_current[1].first + lVar6);
              if (ppVar15 == end._M_current) goto LAB_0035b06e;
              ppVar16 = (pair<double,_int> *)((long)&(_Var8._M_current)->first + lVar6);
              dVar1 = ppVar15->first;
              dVar2 = ppVar16->first;
              if ((dVar1 < dVar2) || ((dVar1 <= dVar2 && (ppVar16[1].second < ppVar16->second)))) {
                iVar3 = ppVar16[1].second;
                ppVar15->first = dVar2;
                ppVar16[1].second = ppVar16->second;
                lVar11 = lVar17;
                ppVar14 = ppVar15;
                ppVar18 = ppVar16;
                if (lVar6 != 0x10) {
                  do {
                    dVar2 = ppVar18[-1].first;
                    if (dVar2 <= dVar1) {
                      ppVar16 = ppVar18;
                      if (dVar2 < dVar1) {
                        ppVar14 = ppVar18 + 1;
                        break;
                      }
                      if (ppVar18[-1].second <= iVar3) break;
                    }
                    ppVar16 = ppVar18 + -1;
                    ppVar18->first = dVar2;
                    ppVar18->second = ppVar18[-1].second;
                    lVar11 = lVar11 + 0x10;
                    ppVar14 = ppVar18;
                    ppVar18 = ppVar16;
                  } while (lVar11 != 0);
                }
                ppVar16->first = dVar1;
                ppVar14[-1].second = iVar3;
                uVar10 = uVar10 + ((long)ppVar15 - (long)ppVar16 >> 4);
              }
              lVar6 = lVar6 + 0x10;
              lVar17 = lVar17 + -0x10;
            } while (uVar10 < 9);
          }
          else {
            lVar6 = 0;
            uVar10 = 0;
            _Var7._M_current = begin._M_current;
            do {
              ppVar15 = _Var7._M_current + 1;
              if (ppVar15 == _Var8._M_current) goto LAB_0035af4a;
              dVar1 = (_Var7._M_current)->first;
              dVar2 = _Var7._M_current[1].first;
              if ((dVar2 < dVar1) ||
                 ((dVar2 <= dVar1 && (_Var7._M_current[1].second < (_Var7._M_current)->second)))) {
                iVar3 = (_Var7._M_current)->second;
                iVar4 = _Var7._M_current[1].second;
                _Var7._M_current[1].first = dVar1;
                _Var7._M_current[1].second = iVar3;
                ppVar16 = ppVar15;
                lVar17 = lVar6;
                if (_Var7._M_current != begin._M_current) {
                  do {
                    ppVar14 = _Var7._M_current;
                    dVar1 = ppVar14[-1].first;
                    if (dVar1 <= dVar2) {
                      _Var7._M_current = ppVar14;
                      if (dVar1 < dVar2) {
                        ppVar16 = ppVar14 + 1;
                        break;
                      }
                      if (ppVar14[-1].second <= iVar4) break;
                    }
                    _Var7._M_current = ppVar14 + -1;
                    ppVar14->first = dVar1;
                    ppVar14->second = ppVar14[-1].second;
                    lVar17 = lVar17 + 0x10;
                    ppVar16 = ppVar14;
                  } while (lVar17 != 0);
                }
                (_Var7._M_current)->first = dVar2;
                ppVar16[-1].second = iVar4;
                uVar10 = uVar10 + ((long)ppVar15 - (long)_Var7._M_current >> 4);
              }
              lVar6 = lVar6 + -0x10;
              _Var7._M_current = ppVar15;
            } while (uVar10 < 9);
          }
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
                  (begin._M_current,_Var8._M_current,local_38);
        bVar5 = false;
        param_4 = 0;
        begin._M_current = ppVar12;
      }
    }
LAB_0035b06e:
    if (bVar5) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }